

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O1

void brotli::EncodeContextMap
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *context_map,size_t num_clusters
               ,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint32_t max_run_length_prefix;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rle_symbols;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_bits;
  vector<unsigned_int,_std::allocator<unsigned_int>_> transformed_symbols;
  uint32_t local_81c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_818;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7e0;
  byte local_7c4 [272];
  uint16_t local_6b4 [282];
  uint32_t local_480 [272];
  long local_40;
  undefined8 local_38;
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters != 1) {
    MoveToFrontTransform(&local_7e0,context_map);
    local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_7f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_7f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_81c = 6;
    RunLengthCodeZeros(&local_7e0,&local_81c,&local_818,&local_7f8);
    memset(local_480,0,0x448);
    uVar4 = local_81c;
    local_38 = 0x7ff0000000000000;
    if ((long)local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      lVar8 = 0;
      do {
        local_480[local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8]] =
             local_480[local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar8]] + 1;
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
      local_40 = local_40 + lVar5;
    }
    uVar7 = (ulong)local_81c;
    uVar6 = *storage_ix;
    uVar1 = uVar6 + 1;
    *(ulong *)(storage + (uVar6 >> 3)) =
         (ulong)(uVar7 != 0) << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
    *storage_ix = uVar1;
    if (uVar7 != 0) {
      if (0x10 < local_81c) {
LAB_00179f19:
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                      ,0x2c,
                      "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                     );
      }
      *(ulong *)(storage + (uVar1 >> 3)) =
           (ulong)(local_81c - 1) << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
      *storage_ix = uVar6 + 5;
    }
    memset(local_7c4,0,0x330);
    BuildAndStoreHuffmanTree(local_480,num_clusters + uVar7,local_7c4,local_6b4,storage_ix,storage);
    if ((long)local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
      lVar8 = 0;
      do {
        bVar2 = local_7c4[local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar8]];
        if (local_6b4[local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar8]] >> (bVar2 & 0x3f) != 0)
        goto LAB_00179f19;
        if (0x38 < bVar2) {
LAB_00179f38:
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                        ,0x2d,
                        "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                       );
        }
        uVar1 = *storage_ix;
        uVar6 = bVar2 + uVar1;
        *(ulong *)(storage + (uVar1 >> 3)) =
             (ulong)local_6b4[local_818.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar8]] << ((byte)uVar1 & 7)
             | (ulong)storage[uVar1 >> 3];
        *storage_ix = uVar6;
        uVar3 = local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        if (uVar3 - 1 < uVar4) {
          if (local_7f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] >> ((byte)uVar3 & 0x3f) != 0)
          goto LAB_00179f19;
          if (0x38 < uVar3) goto LAB_00179f38;
          *(ulong *)(storage + (uVar6 >> 3)) =
               (ulong)local_7f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar8] << ((byte)uVar6 & 7) |
               (ulong)storage[uVar6 >> 3];
          *storage_ix = uVar3 + uVar6;
        }
        lVar8 = lVar8 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar8);
    }
    uVar1 = *storage_ix;
    *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3] | 1L << ((byte)uVar1 & 7);
    *storage_ix = uVar1 + 1;
    if (local_7f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_7f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_7f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_818.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_818.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_818.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_7e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_7e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_7e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void EncodeContextMap(const std::vector<uint32_t>& context_map,
                      size_t num_clusters,
                      size_t* storage_ix, uint8_t* storage) {
  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  std::vector<uint32_t> transformed_symbols = MoveToFrontTransform(context_map);
  std::vector<uint32_t> rle_symbols;
  std::vector<uint32_t> extra_bits;
  uint32_t max_run_length_prefix = 6;
  RunLengthCodeZeros(transformed_symbols, &max_run_length_prefix,
                     &rle_symbols, &extra_bits);
  HistogramContextMap symbol_histogram;
  for (size_t i = 0; i < rle_symbols.size(); ++i) {
    symbol_histogram.Add(rle_symbols[i]);
  }
  bool use_rle = max_run_length_prefix > 0;
  WriteBits(1, use_rle, storage_ix, storage);
  if (use_rle) {
    WriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
  }
  EntropyCodeContextMap symbol_code;
  memset(symbol_code.depth_, 0, sizeof(symbol_code.depth_));
  memset(symbol_code.bits_, 0, sizeof(symbol_code.bits_));
  BuildAndStoreHuffmanTree(symbol_histogram.data_,
                           num_clusters + max_run_length_prefix,
                           symbol_code.depth_, symbol_code.bits_,
                           storage_ix, storage);
  for (size_t i = 0; i < rle_symbols.size(); ++i) {
    WriteBits(symbol_code.depth_[rle_symbols[i]],
              symbol_code.bits_[rle_symbols[i]],
              storage_ix, storage);
    if (rle_symbols[i] > 0 && rle_symbols[i] <= max_run_length_prefix) {
      WriteBits(rle_symbols[i], extra_bits[i], storage_ix, storage);
    }
  }
  WriteBits(1, 1, storage_ix, storage);  // use move-to-front
}